

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PODVector.H
# Opt level: O0

size_type __thiscall
amrex::PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::GetNewCapacity
          (PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *this,
          size_type a_num_to_be_added)

{
  size_type sVar1;
  unsigned_long *puVar2;
  size_type sVar3;
  long in_RSI;
  PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_RDI;
  size_type new_capacity;
  unsigned_long local_28 [2];
  size_type local_18;
  long local_10;
  
  local_10 = in_RSI;
  local_18 = capacity(in_RDI);
  sVar1 = capacity(in_RDI);
  if (sVar1 == 0) {
    local_28[1] = 5;
    local_28[0] = 1;
    puVar2 = std::max<unsigned_long>(local_28 + 1,local_28);
    local_18 = *puVar2;
  }
  for (; sVar1 = local_18, sVar3 = capacity(in_RDI), sVar1 < sVar3 + local_10;
      local_18 = local_18 * 3 + 1 >> 1) {
  }
  return local_18;
}

Assistant:

size_type GetNewCapacity (size_type a_num_to_be_added) const noexcept
        {
            size_type new_capacity = capacity();

            if (capacity() == 0)
            {
                new_capacity = std::max(64 / sizeof(T), size_type(1));
            }

            while (new_capacity < (capacity() + a_num_to_be_added))
            {
                new_capacity = (3 * new_capacity + 1)/2;
            }

            return new_capacity;
        }